

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O1

int anon_unknown.dwarf_747b::RtMidi_getapiname(lua_State *L)

{
  uint uVar1;
  Api api;
  string str;
  string local_30;
  
  uVar1 = luaL_checkinteger(L,1);
  RtMidi::getApiName_abi_cxx11_(&local_30,(RtMidi *)(ulong)uVar1,api);
  lua_pushlstring(L,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return 1;
}

Assistant:

int RtMidi_getapiname(lua_State *L) {
	auto api = static_cast<RtMidi::Api>(luaL_checkinteger(L, 1));
	auto str = RtMidi::getApiName(api);
	lua_pushlstring(L, str.c_str(), str.size());
	return 1;
}